

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall Lexer::advance(Lexer *this)

{
  int *piVar1;
  char cVar2;
  ulong uVar3;
  Lexer *pLVar4;
  
  uVar3 = (long)this->index_ + 1;
  this->index_ = (int)uVar3;
  pLVar4 = (Lexer *)((this->input_)._M_dataplus._M_p + uVar3);
  if ((this->input_)._M_string_length <= uVar3) {
    pLVar4 = this;
  }
  cVar2 = pLVar4->npos;
  this->current_ = cVar2;
  if (cVar2 == '\n') {
    piVar1 = &(this->position_).super_Position.row_;
    *piVar1 = *piVar1 + 1;
    (this->position_).super_Position.col_ = 0;
    return;
  }
  piVar1 = &(this->position_).super_Position.col_;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Lexer::advance() {
    index_++;
    if (index_ >= input_.length()) {
        current_ = npos;
    } else {
        current_ = input_[index_];
    }
    maintain_position();
}